

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input_.cxx
# Opt level: O2

int __thiscall Fl_Input_::undo(Fl_Input_ *this)

{
  uint *puVar1;
  int n;
  size_t __n;
  char *pcVar2;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar3;
  undefined8 extraout_RDX_02;
  int iVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  
  n = undoinsert;
  iVar5 = undocut;
  was_up_down = 0;
  iVar7 = 0;
  if (undowidget == this) {
    if (undocut != 0 || undoinsert != 0) {
      __n = (size_t)undoinsert;
      uVar6 = (long)undoat - __n;
      put_in_buffer(this,this->size_ + undocut);
      iVar4 = (int)uVar6;
      uVar3 = extraout_RDX;
      iVar7 = iVar4;
      if (iVar5 != 0) {
        memmove(this->buffer + uVar6 + iVar5,this->buffer + uVar6,(long)((this->size_ - iVar4) + 1))
        ;
        memcpy(this->buffer + uVar6,undobuffer,(long)iVar5);
        this->size_ = this->size_ + iVar5;
        iVar7 = iVar5 + iVar4;
        uVar3 = extraout_RDX_00;
      }
      if (n != 0) {
        undobuffersize(n);
        memcpy(undobuffer,this->buffer + iVar7,__n);
        memmove(this->buffer + iVar7,this->buffer + iVar7 + __n,
                (long)((this->size_ - (n + iVar7)) + 1));
        this->size_ = this->size_ - n;
        yankcut = n;
        uVar3 = extraout_RDX_01;
      }
      undocut = n;
      undoinsert = iVar5;
      undoat = iVar7;
      this->mark_ = iVar7;
      this->position_ = iVar7;
      if ((0 < iVar4 & (this->super_Fl_Widget).type_ >> 4) == 1) {
        do {
          iVar5 = (int)uVar6;
          pcVar2 = index(this,(char *)(uVar6 & 0xffffffff),(int)uVar3);
          if ((int)pcVar2 == 10) goto LAB_001ba131;
          uVar6 = (ulong)(iVar5 - 1);
          uVar3 = extraout_RDX_02;
        } while (1 < iVar5);
        uVar6 = 0;
      }
LAB_001ba131:
      minimal_update(this,(int)uVar6);
      puVar1 = &(this->super_Fl_Widget).flags_;
      *(byte *)puVar1 = (byte)*puVar1 | 0x80;
      iVar7 = 1;
      if (((this->super_Fl_Widget).when_ & 1) != 0) {
        Fl_Widget::do_callback(&this->super_Fl_Widget);
      }
    }
  }
  return iVar7;
}

Assistant:

int Fl_Input_::undo() {
  was_up_down = 0;
  if ( undowidget != this || (!undocut && !undoinsert) ) return 0;

  int ilen = undocut;
  int xlen = undoinsert;
  int b = undoat-xlen;
  int b1 = b;

  put_in_buffer(size_+ilen);

  if (ilen) {
    memmove(buffer+b+ilen, buffer+b, size_-b+1);
    memcpy(buffer+b, undobuffer, ilen);
    size_ += ilen;
    b += ilen;
  }

  if (xlen) {
    undobuffersize(xlen);
    memcpy(undobuffer, buffer+b, xlen);
    memmove(buffer+b, buffer+b+xlen, size_-xlen-b+1);
    size_ -= xlen;
  }

  undocut = xlen;
  if (xlen) yankcut = xlen;
  undoinsert = ilen;
  undoat = b;
  mark_ = b /* -ilen */;
  position_ = b;

  if (wrap())
    while (b1 > 0 && index(b1)!='\n') b1--;
  minimal_update(b1);
  set_changed();
  if (when()&FL_WHEN_CHANGED) do_callback();
  return 1;
}